

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleFromVoxels.h
# Opt level: O3

bool __thiscall
nanovdb::
TrilinearSampler<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
::update<nanovdb::Vec3<float>>
          (TrilinearSampler<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
           *this,Vec3<float> *xyz)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  ValueType *pVVar5;
  undefined4 in_register_00000014;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  CoordType local_20;
  
  fVar1 = xyz->mVec[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)xyz->mVec;
  auVar6 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar3 = vroundps_avx(auVar7,9);
  auVar7 = vsubps_avx(auVar7,auVar3);
  local_20.mVec[2] = (int32_t)auVar6._0_4_;
  uVar2 = vmovlps_avx(auVar7);
  *(undefined8 *)xyz->mVec = uVar2;
  xyz->mVec[2] = fVar1 - auVar6._0_4_;
  auVar6 = vmovshdup_avx(auVar3);
  local_20.mVec._0_8_ =
       ((ulong)(uint)(int)auVar6._0_4_ << 0x20) + CONCAT44(in_register_00000014,(int)auVar3._0_4_);
  if (((*(int *)(this + 8) == (int)auVar3._0_4_) && (*(uint *)(this + 0xc) == (int)auVar6._0_4_)) &&
     (*(int *)(this + 0x10) == local_20.mVec[2])) {
    bVar4 = false;
  }
  else {
    *(int32_t *)(this + 0x10) = local_20.mVec[2];
    *(undefined8 *)(this + 8) = local_20.mVec._0_8_;
    pVVar5 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_20);
    *(ValueType *)(this + 0x14) = *pVVar5;
    local_20.mVec[2] = local_20.mVec[2] + 1;
    pVVar5 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_20);
    *(ValueType *)(this + 0x18) = *pVVar5;
    local_20.mVec[1] = local_20.mVec[1] + 1;
    pVVar5 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_20);
    *(ValueType *)(this + 0x20) = *pVVar5;
    local_20.mVec[2] = local_20.mVec[2] + -1;
    pVVar5 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_20);
    *(ValueType *)(this + 0x1c) = *pVVar5;
    auVar6._8_8_ = 0;
    auVar6._0_4_ = local_20.mVec[0];
    auVar6._4_4_ = local_20.mVec[1];
    auVar6 = vpaddd_avx(auVar6,_DAT_00620670);
    local_20.mVec._0_8_ = auVar6._0_8_;
    pVVar5 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_20);
    *(ValueType *)(this + 0x24) = *pVVar5;
    local_20.mVec[2] = local_20.mVec[2] + 1;
    pVVar5 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_20);
    *(ValueType *)(this + 0x28) = *pVVar5;
    local_20.mVec[1] = local_20.mVec[1] + 1;
    pVVar5 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_20);
    *(ValueType *)(this + 0x30) = *pVVar5;
    local_20.mVec[2] = local_20.mVec[2] + -1;
    pVVar5 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
             ::getValue((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                         *)(*(long *)this + *(long *)(*(long *)this + 0x18)),&local_20);
    bVar4 = true;
    *(ValueType *)(this + 0x2c) = *pVVar5;
  }
  return bVar4;
}

Assistant:

bool TrilinearSampler<TreeOrAccT>::update(Vec3T& xyz)
{
    CoordT ijk = Floor<CoordT>(xyz);

    if (ijk == mPos)
        return false; // early out - reuse cached values

    mPos = ijk;

    mVal[0][0][0] = mAcc->getValue(ijk); // i, j, k

    ijk[2] += 1;
    mVal[0][0][1] = mAcc->getValue(ijk); // i, j, k + 1

    ijk[1] += 1;
    mVal[0][1][1] = mAcc->getValue(ijk); // i, j+1, k + 1

    ijk[2] -= 1;
    mVal[0][1][0] = mAcc->getValue(ijk); // i, j+1, k

    ijk[0] += 1;
    ijk[1] -= 1;
    mVal[1][0][0] = mAcc->getValue(ijk); // i+1, j, k

    ijk[2] += 1;
    mVal[1][0][1] = mAcc->getValue(ijk); // i+1, j, k + 1

    ijk[1] += 1;
    mVal[1][1][1] = mAcc->getValue(ijk); // i+1, j+1, k + 1

    ijk[2] -= 1;
    mVal[1][1][0] = mAcc->getValue(ijk); // i+1, j+1, k

    return true;
}